

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

bool isColDataNull(HighsLogOptions *log_options,double *usr_col_cost,double *usr_col_lower,
                  double *usr_col_upper)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"column costs",&local_89);
  bVar1 = doubleUserDataNotNull(log_options,usr_col_cost,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"column lower bounds",&local_89);
  bVar2 = doubleUserDataNotNull(log_options,usr_col_lower,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_88,"column upper bounds",&local_89);
  bVar3 = doubleUserDataNotNull(log_options,usr_col_upper,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return (bVar1 || bVar2) || bVar3;
}

Assistant:

bool isColDataNull(const HighsLogOptions& log_options,
                   const double* usr_col_cost, const double* usr_col_lower,
                   const double* usr_col_upper) {
  bool null_data = false;
  null_data =
      doubleUserDataNotNull(log_options, usr_col_cost, "column costs") ||
      null_data;
  null_data = doubleUserDataNotNull(log_options, usr_col_lower,
                                    "column lower bounds") ||
              null_data;
  null_data = doubleUserDataNotNull(log_options, usr_col_upper,
                                    "column upper bounds") ||
              null_data;
  return null_data;
}